

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bork.cpp
# Opt level: O1

void read_exp(ifstream *f,string *buf)

{
  undefined8 in_RAX;
  char cVar1;
  int iVar2;
  char c;
  
  cVar1 = (char)((ulong)in_RAX >> 0x38);
  std::istream::get((char *)f);
  if (cVar1 != '(') {
    iVar2 = *(int *)(f + *(long *)(*(long *)f + -0x18) + 0x20);
    while ((iVar2 == 0 && (std::istream::get((char *)f), cVar1 != '('))) {
      iVar2 = *(int *)(f + *(long *)(*(long *)f + -0x18) + 0x20);
    }
  }
  std::__cxx11::string::push_back((char)buf);
  if (*(int *)(f + *(long *)(*(long *)f + -0x18) + 0x20) == 0) {
    iVar2 = 1;
    do {
      std::istream::get((char *)f);
      std::__cxx11::string::push_back((char)buf);
      if (*(int *)(f + *(long *)(*(long *)f + -0x18) + 0x20) != 0) {
        return;
      }
      iVar2 = (iVar2 - (uint)(cVar1 == ')')) + (uint)(cVar1 == '(');
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void read_exp(std::ifstream &f, std::string &buf) {

  char c;

  f.get(c);
  while (c!='(' && f.good()) f.get(c);

  buf.push_back(c);
  int stack = 1;

  while (f.good() && stack) {

    f.get(c);
    buf += c;

    if (c==')') stack--;
    if (c=='(') stack++;

  }

}